

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sigma.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Sigma::Get_y(ChFunction_Sigma *this,double x)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  
  dVar2 = this->start;
  dVar5 = 0.0;
  if (dVar2 <= x) {
    dVar5 = this->amp;
    if (x <= this->end) {
      dVar2 = (x - dVar2) / (this->end - dVar2);
      dVar3 = pow(dVar2,3.0);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dVar2 * dVar2;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar3 * -2.0;
      auVar1 = vfmadd231sd_fma(auVar4,ZEXT816(0x4008000000000000),auVar1);
      dVar5 = dVar5 * auVar1._0_8_;
    }
  }
  return dVar5;
}

Assistant:

double ChFunction_Sigma::Get_y(double x) const {
    double ret;
    double A = (end - start);
    if (x < start)
        return 0;
    if (x > end)
        return amp;
    else {
        ret = amp * ((3 * (pow(((x - start) / A), 2))) - 2 * (pow(((x - start) / A), 3)));
    }
    return ret;
}